

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HistogramBasedDistribution.cpp
# Opt level: O0

unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
 __thiscall
HistogramBasedDistribution::toDistribution
          (HistogramBasedDistribution *this,double tailCutoff,int *offset)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  ulong uVar4;
  void *__s;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *pvVar5;
  int *in_RDX;
  long in_RSI;
  __uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
  in_RDI;
  double in_XMM0_Qa;
  double dVar6;
  int end_2;
  int start_2;
  int i;
  int k;
  double p_1;
  int length_1;
  int end_1;
  int start_1;
  size_t i_2;
  int max_insert_length;
  double p;
  int length;
  int end;
  int start;
  size_t i_1;
  double p_sum;
  int min_idx;
  int min_insert_length;
  unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
  *result;
  pointer in_stack_fffffffffffffee8;
  unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  int local_e4;
  int local_cc;
  int local_84;
  int local_80;
  size_type local_60;
  ulong local_38;
  double local_30;
  int local_28;
  int local_24;
  
  local_24 = *(int *)(in_RSI + 8);
  local_28 = -1;
  local_30 = 0.0;
  for (local_38 = 0;
      sVar2 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                        ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                         )(in_RSI + 0x10)), local_38 < sVar2; local_38 = local_38 + 1) {
    pvVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
             operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                        (in_RSI + 0x10),local_38);
    iVar1 = pvVar3->first;
    sVar2 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                      ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       (in_RSI + 0x10));
    if (local_38 + 1 < sVar2) {
      pvVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
               operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           *)(in_RSI + 0x10),local_38 + 1);
      local_cc = pvVar3->first + -1;
    }
    else {
      local_cc = *(int *)(in_RSI + 0xc);
    }
    pvVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
             operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                        (in_RSI + 0x10),local_38);
    dVar6 = pvVar3->second * (double)((local_cc - iVar1) + 1);
    if (in_XMM0_Qa < local_30 + dVar6) {
      pvVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
               operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           *)(in_RSI + 0x10),local_38);
      local_24 = iVar1 + (int)((in_XMM0_Qa - local_30) / pvVar3->second);
      local_28 = (int)local_38;
      break;
    }
    local_30 = dVar6 + local_30;
  }
  local_30 = 0.0;
  uVar4 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                    ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     (in_RSI + 0x10));
  while( true ) {
    local_60 = uVar4 - 1;
    pvVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
             operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                        (in_RSI + 0x10),local_60);
    iVar1 = pvVar3->first;
    sVar2 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                      ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       (in_RSI + 0x10));
    if (uVar4 < sVar2) {
      pvVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
               operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           *)(in_RSI + 0x10),uVar4);
      local_e4 = pvVar3->first + -1;
    }
    else {
      local_e4 = *(int *)(in_RSI + 0xc);
    }
    pvVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
             operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                        (in_RSI + 0x10),local_60);
    dVar6 = pvVar3->second * (double)((local_e4 - iVar1) + 1);
    if (in_XMM0_Qa < local_30 + dVar6) break;
    local_30 = dVar6 + local_30;
    uVar4 = local_60;
  }
  pvVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                     ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                      (in_RSI + 0x10),local_60);
  dVar6 = pvVar3->second;
  __s = operator_new(0x18);
  memset(__s,0,0x18);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2a07ff);
  std::
  unique_ptr<std::vector<double,std::allocator<double>>,std::default_delete<std::vector<double,std::allocator<double>>>>
  ::unique_ptr<std::default_delete<std::vector<double,std::allocator<double>>>,void>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  local_80 = local_28;
  local_84 = local_24;
  do {
    while( true ) {
      if (local_e4 - (int)((in_XMM0_Qa - local_30) / dVar6) < local_84) goto LAB_002a097f;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                 (in_RSI + 0x10),(long)local_80);
      this_00 = (vector<double,_std::allocator<double>_> *)(long)(local_80 + 1);
      pvVar5 = (vector<double,_std::allocator<double>_> *)
               std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                         ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           *)(in_RSI + 0x10));
      if (this_00 < pvVar5) {
        pvVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                 operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             *)(in_RSI + 0x10),(long)(local_80 + 1));
        iVar1 = pvVar3->first + -1;
      }
      else {
        iVar1 = *(int *)(in_RSI + 0xc);
      }
      if (iVar1 < local_84) break;
      std::
      unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
      ::operator->((unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
                    *)0x2a0920);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                 (in_RSI + 0x10),(long)local_80);
      std::vector<double,_std::allocator<double>_>::push_back
                (this_00,(value_type_conflict4 *)CONCAT44(iVar1,in_stack_fffffffffffffef8));
      local_84 = local_84 + 1;
    }
    local_80 = local_80 + 1;
    uVar4 = (ulong)local_80;
    sVar2 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                      ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       (in_RSI + 0x10));
  } while (uVar4 < sVar2);
LAB_002a097f:
  *in_RDX = local_24;
  return (__uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
          )(tuple<std::vector<double,_std::allocator<double>_>_*,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
            )in_RDI.
             super___uniq_ptr_impl<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>_*,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
             .super__Head_base<0UL,_std::vector<double,_std::allocator<double>_>_*,_false>.
             _M_head_impl;
}

Assistant:

std::unique_ptr<std::vector<double> > HistogramBasedDistribution::toDistribution(double tailCutoff, int* offset) const {
	// determine start point
	int min_insert_length = min;
	int min_idx = -1;
	double p_sum = 0.0;
	for (size_t i=0; i<values.size(); ++i) {
		int start = values[i].first;
		int end = (i+1 < values.size())? values[i+1].first-1:max;
		int length = end - start + 1;
		double p = values[i].second * length;
		if (p_sum + p > tailCutoff) {
			min_insert_length = start + int((tailCutoff - p_sum) / values[i].second);
			min_idx = i;
			break;
		}
		p_sum += p;
	}
	// determine end point
	int max_insert_length = max;
	p_sum = 0.0;
	for (size_t i=values.size()-1; i>=0; --i) {
		int start = values[i].first;
		int end = (i+1 < values.size())? values[i+1].first-1:max;
		int length = end - start + 1;
		double p = values[i].second * length;
		if (p_sum + p > tailCutoff) {
			max_insert_length = end - int((tailCutoff - p_sum) / values[i].second);
			break;
		}
		p_sum += p;
	}
	// create result
	unique_ptr<vector<double> > result(new vector<double>());
	int k = min_idx;
	int i = min_insert_length;
	while (i <= max_insert_length) {
		int start = values[k].first;
		int end = (k+1 < values.size())? values[k+1].first-1:max;
		assert(start <= i);
		if (i > end) {
			k += 1;
			if (k >= values.size()) break;
			else continue;
		}
		result->push_back(values[k].second);
		i += 1;
	}
	*offset = min_insert_length;
	return result;
}